

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UA_decodeBinary(UA_ByteString *src,size_t *offset,void *dst,UA_DataType *type)

{
  UA_StatusCode UVar1;
  UA_StatusCode retval;
  UA_DataType *type_local;
  void *dst_local;
  size_t *offset_local;
  UA_ByteString *src_local;
  
  memset(dst,0,(ulong)type->memSize);
  pos = src->data + *offset;
  end = src->data + src->length;
  UVar1 = UA_decodeBinaryInternal(dst,type);
  if (UVar1 == 0) {
    *offset = (long)pos - (long)src->data;
  }
  else {
    UA_deleteMembers(dst,type);
  }
  return UVar1;
}

Assistant:

UA_StatusCode
UA_decodeBinary(const UA_ByteString *src, size_t *offset,
                void *dst, const UA_DataType *type) {
    /* Initialize the destination */
    memset(dst, 0, type->memSize);

    /* Set the (thread-local) position and end pointers to save function
       arguments */
    pos = &src->data[*offset];
    end = &src->data[src->length];

    /* Decode */
    UA_StatusCode retval = UA_decodeBinaryInternal(dst, type);

    /* Clean up */
    if(retval == UA_STATUSCODE_GOOD)
        *offset = (size_t)(pos - src->data) / sizeof(UA_Byte);
    else
        UA_deleteMembers(dst, type);
    return retval;
}